

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

void ImageT<unsigned_char,_2U>::checkResamplerStatus(Resampler *resampler,char *pFilter)

{
  Status SVar1;
  runtime_error *prVar2;
  v10 *in_RSI;
  Resampler *in_RDI;
  undefined1 in_stack_00000108 [16];
  undefined1 in_stack_00000118 [16];
  char *local_118 [2];
  string local_108 [48];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*> local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_a8;
  char *local_a0;
  size_t local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*> *local_90
  ;
  char *local_88;
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char **local_58;
  undefined8 *local_50;
  char *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_20;
  undefined8 local_18;
  undefined8 *local_10;
  char *local_8;
  
  SVar1 = basisu::Resampler::status(in_RDI);
  switch(SVar1) {
  case STATUS_OKAY:
    break;
  case STATUS_OUT_OF_MEMORY:
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Resampler or Resampler::put_line out of memory.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case STATUS_BAD_FILTER_NAME:
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68 = local_118;
    local_70 = "Unknown filter: {}";
    local_60 = "Unknown filter: {}";
    local_118[0] = "Unknown filter: {}";
    local_58 = local_68;
    local_98 = std::char_traits<char>::length((char_type *)0x151165);
    local_8 = local_70;
    local_78 = local_108;
    local_88 = local_118[0];
    local_90 = &local_d8;
    local_50 = &local_88;
    local_a0 = local_118[0];
    sStack_80 = local_98;
    local_48 = local_a0;
    sStack_40 = local_98;
    local_c8[0] = fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*>
                            (local_90,in_RSI,(char **)local_78);
    local_30 = &local_b0;
    local_38 = local_c8;
    local_18 = 0xc;
    local_b0 = 0xc;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    local_a8 = local_38;
    fmt::v10::vformat_abi_cxx11_((string_view)in_stack_00000118,(format_args)in_stack_00000108);
    std::runtime_error::runtime_error(prVar2,local_108);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case STATUS_SCAN_BUFFER_FULL:
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Resampler::put_line scan buffer full.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

static void checkResamplerStatus(basisu::Resampler& resampler, const char* pFilter) {
        using Status = basisu::Resampler::Status;

        switch (resampler.status()) {
        case Status::STATUS_OKAY:
            break;
        case Status::STATUS_OUT_OF_MEMORY:
            throw std::runtime_error("Resampler or Resampler::put_line out of memory.");
        case Status::STATUS_BAD_FILTER_NAME:
            throw std::runtime_error(fmt::format("Unknown filter: {}", pFilter));
        case Status::STATUS_SCAN_BUFFER_FULL:
            throw std::runtime_error("Resampler::put_line scan buffer full.");
        }
    }